

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# app.cc
# Opt level: O2

bool __thiscall
uttamarin::App::RunOnLemmas
          (App *this,vector<uttamarin::LemmaJob,_std::allocator<uttamarin::LemmaJob>_> *lemma_jobs)

{
  int false_lemmas;
  LemmaJob *pLVar1;
  TheoryPreprocessor *pTVar2;
  _Head_base<0UL,_uttamarin::LemmaProcessor_*,_false> _Var3;
  int iVar4;
  mapped_type *pmVar5;
  string preprocessed_spthy_file;
  unordered_map<uttamarin::ProverResult,_int,_std::hash<uttamarin::ProverResult>,_std::equal_to<uttamarin::ProverResult>,_std::allocator<std::pair<const_uttamarin::ProverResult,_int>_>_>
  count_of;
  value_type lemma_job;
  string local_f8;
  string local_d8;
  string local_b8;
  _Hashtable<uttamarin::ProverResult,_std::pair<const_uttamarin::ProverResult,_int>,_std::allocator<std::pair<const_uttamarin::ProverResult,_int>_>,_std::__detail::_Select1st,_std::equal_to<uttamarin::ProverResult>,_std::hash<uttamarin::ProverResult>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_98;
  LemmaJob local_60;
  
  PrintHeader(this);
  local_98._M_buckets = &local_98._M_single_bucket;
  local_98._M_bucket_count = 1;
  local_98._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_98._M_element_count = 0;
  local_98._M_rehash_policy._M_max_load_factor = 1.0;
  local_98._M_rehash_policy._M_next_resize = 0;
  local_98._M_single_bucket = (__node_base_ptr)0x0;
  pLVar1 = (lemma_jobs->
           super__Vector_base<uttamarin::LemmaJob,_std::allocator<uttamarin::LemmaJob>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((lemma_jobs->super__Vector_base<uttamarin::LemmaJob,_std::allocator<uttamarin::LemmaJob>_>).
      _M_impl.super__Vector_impl_data._M_finish == pLVar1) {
    local_60.spthy_file_path_._M_dataplus._M_p._0_4_ = 0;
    pmVar5 = std::__detail::
             _Map_base<uttamarin::ProverResult,_std::pair<const_uttamarin::ProverResult,_int>,_std::allocator<std::pair<const_uttamarin::ProverResult,_int>_>,_std::__detail::_Select1st,_std::equal_to<uttamarin::ProverResult>,_std::hash<uttamarin::ProverResult>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<uttamarin::ProverResult,_std::pair<const_uttamarin::ProverResult,_int>,_std::allocator<std::pair<const_uttamarin::ProverResult,_int>_>,_std::__detail::_Select1st,_std::equal_to<uttamarin::ProverResult>,_std::hash<uttamarin::ProverResult>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)&local_98,(key_type *)&local_60);
    iVar4 = *pmVar5;
    local_b8._M_dataplus._M_p._0_4_ = 1;
    pmVar5 = std::__detail::
             _Map_base<uttamarin::ProverResult,_std::pair<const_uttamarin::ProverResult,_int>,_std::allocator<std::pair<const_uttamarin::ProverResult,_int>_>,_std::__detail::_Select1st,_std::equal_to<uttamarin::ProverResult>,_std::hash<uttamarin::ProverResult>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<uttamarin::ProverResult,_std::pair<const_uttamarin::ProverResult,_int>,_std::allocator<std::pair<const_uttamarin::ProverResult,_int>_>,_std::__detail::_Select1st,_std::equal_to<uttamarin::ProverResult>,_std::hash<uttamarin::ProverResult>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)&local_98,(key_type *)&local_b8);
    false_lemmas = *pmVar5;
    local_f8._M_dataplus._M_p._0_4_ = 2;
    pmVar5 = std::__detail::
             _Map_base<uttamarin::ProverResult,_std::pair<const_uttamarin::ProverResult,_int>,_std::allocator<std::pair<const_uttamarin::ProverResult,_int>_>,_std::__detail::_Select1st,_std::equal_to<uttamarin::ProverResult>,_std::hash<uttamarin::ProverResult>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<uttamarin::ProverResult,_std::pair<const_uttamarin::ProverResult,_int>,_std::allocator<std::pair<const_uttamarin::ProverResult,_int>_>,_std::__detail::_Select1st,_std::equal_to<uttamarin::ProverResult>,_std::hash<uttamarin::ProverResult>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)&local_98,(key_type *)&local_f8);
    PrintFooter(this,iVar4,false_lemmas,*pmVar5,0);
    std::
    _Hashtable<uttamarin::ProverResult,_std::pair<const_uttamarin::ProverResult,_int>,_std::allocator<std::pair<const_uttamarin::ProverResult,_int>_>,_std::__detail::_Select1st,_std::equal_to<uttamarin::ProverResult>,_std::hash<uttamarin::ProverResult>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::~_Hashtable(&local_98);
    return true;
  }
  LemmaJob::LemmaJob(&local_60,pLVar1);
  pTVar2 = (this->theory_preprocessor_)._M_t.
           super___uniq_ptr_impl<uttamarin::TheoryPreprocessor,_std::default_delete<uttamarin::TheoryPreprocessor>_>
           ._M_t.
           super__Tuple_impl<0UL,_uttamarin::TheoryPreprocessor_*,_std::default_delete<uttamarin::TheoryPreprocessor>_>
           .super__Head_base<0UL,_uttamarin::TheoryPreprocessor_*,_false>._M_head_impl;
  LemmaJob::GetSpthyFilePath_abi_cxx11_(&local_f8,&local_60);
  LemmaJob::GetLemmaName_abi_cxx11_(&local_d8,&local_60);
  (*pTVar2->_vptr_TheoryPreprocessor[2])(&local_b8,pTVar2,&local_f8,&local_d8);
  std::__cxx11::string::~string((string *)&local_d8);
  std::__cxx11::string::~string((string *)&local_f8);
  LemmaJob::SetSpthyFilePath(&local_60,&local_b8);
  _Var3._M_head_impl =
       (this->lemma_processor_)._M_t.
       super___uniq_ptr_impl<uttamarin::LemmaProcessor,_std::default_delete<uttamarin::LemmaProcessor>_>
       ._M_t.
       super__Tuple_impl<0UL,_uttamarin::LemmaProcessor_*,_std::default_delete<uttamarin::LemmaProcessor>_>
       .super__Head_base<0UL,_uttamarin::LemmaProcessor_*,_false>._M_head_impl;
  iVar4 = (*(_Var3._M_head_impl)->_vptr_LemmaProcessor[2])(_Var3._M_head_impl,&local_60);
  std::__cxx11::string::~string((string *)&local_b8);
  LemmaJob::~LemmaJob(&local_60);
  std::
  _Hashtable<uttamarin::ProverResult,_std::pair<const_uttamarin::ProverResult,_int>,_std::allocator<std::pair<const_uttamarin::ProverResult,_int>_>,_std::__detail::_Select1st,_std::equal_to<uttamarin::ProverResult>,_std::hash<uttamarin::ProverResult>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&local_98);
  _Unwind_Resume(iVar4);
}

Assistant:

bool App::RunOnLemmas(const vector<LemmaJob>& lemma_jobs) {
  PrintHeader();

  bool success = true;
  unordered_map<ProverResult, int> count_of;
  int overall_duration = 0;

  for(int i=0;i < lemma_jobs.size();i++) {
    auto lemma_job = lemma_jobs[i];
    auto preprocessed_spthy_file =
            theory_preprocessor_->PreprocessAndReturnPathToResultingFile(
                    lemma_job.GetSpthyFilePath(), lemma_job.GetLemmaName());

    lemma_job.SetSpthyFilePath(preprocessed_spthy_file);
    auto output = lemma_processor_->ProcessLemma(lemma_job);

    PrintLemmaResults(lemma_job, output, i+1, lemma_jobs.size());

    overall_duration += output.duration;
    count_of[output.result]++;
    std::remove(preprocessed_spthy_file.c_str());
    if(output.result != ProverResult::True) {
      success = false;
      if(config_->IsAbortAfterFailure()) break;
    }
  }

  PrintFooter(count_of[ProverResult::True], count_of[ProverResult::False],
              count_of[ProverResult::Unknown], overall_duration);

  return success;
}